

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_import(lysp_yin_ctx *ctx,import_meta *imp_meta)

{
  lysp_import *plVar1;
  lysp_ext_instance *object;
  lysp_import *plVar2;
  LY_ERR LVar3;
  undefined8 *puVar4;
  long lVar5;
  lysp_import **pplVar6;
  yin_subelement subelems [5];
  yin_subelement local_a8;
  undefined4 local_90;
  char **local_88;
  undefined2 local_80;
  undefined4 local_78;
  char **local_70;
  undefined2 local_68;
  undefined4 local_60;
  char *local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pplVar6 = imp_meta->imports;
  plVar1 = *pplVar6;
  if (plVar1 == (lysp_import *)0x0) {
    puVar4 = (undefined8 *)malloc(0x48);
    if (puVar4 != (undefined8 *)0x0) {
      *puVar4 = 1;
      goto LAB_00185745;
    }
  }
  else {
    lVar5 = *(long *)(plVar1[-1].rev + 6) + 1;
    *(long *)(plVar1[-1].rev + 6) = lVar5;
    puVar4 = (undefined8 *)realloc(plVar1[-1].rev + 6,lVar5 * 0x40 | 8);
    pplVar6 = imp_meta->imports;
    if (puVar4 != (undefined8 *)0x0) {
LAB_00185745:
      *pplVar6 = (lysp_import *)(puVar4 + 1);
      plVar1 = *imp_meta->imports;
      lVar5 = *(long *)(plVar1[-1].rev + 6);
      local_a8.dest = &plVar1[lVar5 + -1].dsc;
      plVar2 = plVar1 + lVar5 + -1;
      plVar2->flags = 0;
      plVar2->rev[0] = '\0';
      plVar2->rev[1] = '\0';
      plVar2->rev[2] = '\0';
      plVar2->rev[3] = '\0';
      plVar2->rev[4] = '\0';
      plVar2->rev[5] = '\0';
      *(undefined8 *)(plVar1[lVar5 + -1].rev + 6) = 0;
      plVar1[lVar5 + -1].ref = (char *)0x0;
      plVar1[lVar5 + -1].exts = (lysp_ext_instance *)0x0;
      plVar1[lVar5 + -1].prefix = (char *)0x0;
      plVar1[lVar5 + -1].dsc = (char *)0x0;
      plVar1[lVar5 + -1].module = (lys_module *)0x0;
      plVar1[lVar5 + -1].name = (char *)0x0;
      local_a8.type = LY_STMT_DESCRIPTION;
      local_a8.flags = 2;
      local_90 = 0x240000;
      local_80 = 3;
      local_78 = 0x270000;
      local_70 = &plVar1[lVar5 + -1].ref;
      local_68 = 2;
      local_60 = 0x2b0000;
      local_58 = plVar1[lVar5 + -1].rev;
      local_50 = 2;
      uStack_40 = 0;
      local_38 = 0;
      local_48 = 0xf0000;
      local_88 = &plVar1[lVar5 + -1].prefix;
      LVar3 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = yin_parse_attribute(ctx,YIN_ARG_MODULE,&plVar1[lVar5 + -1].name,Y_IDENTIF_ARG,
                                  LY_STMT_IMPORT);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = yin_parse_content(ctx,&local_a8,5,plVar1 + lVar5 + -1,LY_STMT_IMPORT,(char **)0x0,
                                &plVar1[lVar5 + -1].exts);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      object = plVar1[lVar5 + -1].exts;
      if ((object != (lysp_ext_instance *)0x0) &&
         (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0),
         LVar3 != LY_SUCCESS)) {
        return LVar3;
      }
      LVar3 = lysp_check_prefix((lysp_ctx *)ctx,*imp_meta->imports,imp_meta->prefix,
                                &plVar1[lVar5 + -1].prefix);
      if (LVar3 != LY_SUCCESS) {
        return LY_EVALID;
      }
      return LY_SUCCESS;
    }
    *(long *)((*pplVar6)[-1].rev + 6) = *(long *)((*pplVar6)[-1].rev + 6) + -1;
  }
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_import");
  return LY_EMEM;
}

Assistant:

static LY_ERR
yin_parse_import(struct lysp_yin_ctx *ctx, struct import_meta *imp_meta)
{
    struct lysp_import *imp;

    /* allocate new element in sized array for import */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *imp_meta->imports, imp, LY_EMEM);

    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &imp->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_PREFIX, &imp->prefix, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &imp->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REVISION_DATE, imp->rev, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    /* parse import attributes */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_MODULE, &imp->name, Y_IDENTIF_ARG, LY_STMT_IMPORT));
    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), imp, LY_STMT_IMPORT, NULL, &imp->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, imp->exts));

    /* check prefix validity */
    LY_CHECK_RET(lysp_check_prefix((struct lysp_ctx *)ctx, *imp_meta->imports, imp_meta->prefix, &imp->prefix), LY_EVALID);

    return LY_SUCCESS;
}